

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::ConvertLatin1ToUTF8(StringPiece *latin1,string *utf)

{
  int i;
  long lVar1;
  Rune r;
  char buf [4];
  uint local_30;
  char local_2c [4];
  
  utf->_M_string_length = 0;
  *(utf->_M_dataplus)._M_p = '\0';
  for (lVar1 = 0; lVar1 < latin1->length_; lVar1 = lVar1 + 1) {
    local_30 = (uint)(byte)latin1->ptr_[lVar1];
    runetochar(local_2c,(Rune *)&local_30);
    std::__cxx11::string::append((char *)utf,(ulong)local_2c);
  }
  return;
}

Assistant:

void ConvertLatin1ToUTF8(const StringPiece& latin1, string* utf) {
  char buf[UTFmax];

  utf->clear();
  for (int i = 0; i < latin1.size(); i++) {
    Rune r = latin1[i] & 0xFF;
    int n = runetochar(buf, &r);
    utf->append(buf, n);
  }
}